

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

bool __thiscall
fmt::v11::format_facet<std::locale>::do_put
          (format_facet<std::locale> *this,appender out,loc_value val,format_specs *specs)

{
  bool bVar1;
  undefined1 local_88 [48];
  string local_58 [32];
  string local_38 [32];
  
  local_88._0_8_ = out.container;
  local_88._8_8_ = specs;
  std::__cxx11::string::string
            ((string *)(local_88 + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->separator_)
  ;
  std::__cxx11::string::string
            (local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &this->grouping_);
  std::__cxx11::string::string
            (local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &this->decimal_point_);
  bVar1 = loc_value::visit<fmt::v11::detail::loc_writer<char>>(&val,(loc_writer<char> *)local_88);
  detail::loc_writer<char>::~loc_writer((loc_writer<char> *)local_88);
  return bVar1;
}

Assistant:

FMT_API FMT_FUNC auto format_facet<std::locale>::do_put(
    appender out, loc_value val, const format_specs& specs) const -> bool {
  return val.visit(
      detail::loc_writer<>{out, specs, separator_, grouping_, decimal_point_});
}